

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityTestOutput.cpp
# Opt level: O0

void __thiscall TeamCityTestOutput::printEscaped(TeamCityTestOutput *this,char *s)

{
  char *in_RSI;
  long *in_RDI;
  char str [3];
  char local_13;
  char local_12;
  undefined1 local_11;
  char *local_10;
  
  for (local_10 = in_RSI; *local_10 != '\0'; local_10 = local_10 + 1) {
    if ((((*local_10 == '\'') || (*local_10 == '|')) || (*local_10 == '[')) || (*local_10 == ']')) {
      local_13 = '|';
      local_12 = *local_10;
      local_11 = 0;
    }
    else if (*local_10 == '\r') {
      local_13 = '|';
      local_12 = 'r';
      local_11 = 0;
    }
    else if (*local_10 == '\n') {
      local_13 = '|';
      local_12 = 'n';
      local_11 = 0;
    }
    else {
      local_13 = *local_10;
      local_12 = '\0';
    }
    (**(code **)(*in_RDI + 0x50))(in_RDI,&local_13);
  }
  return;
}

Assistant:

void TeamCityTestOutput::printEscaped(const char* s)
{
    while (*s) {
        char str[3];
        if ((*s == '\'') || (*s == '|') || (*s == '[') || (*s == ']')) {
            str[0] = '|';
            str[1] = *s;
            str[2] = 0;
        } else if (*s == '\r') {
            str[0] = '|';
            str[1] = 'r';
            str[2] = 0;
        } else if (*s == '\n') {
            str[0] = '|';
            str[1] = 'n';
            str[2] = 0;
        } else {
            str[0] = *s;
            str[1] = 0;
        }
        printBuffer(str);
        s++;
    }
}